

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O2

void parasail_close(parasail_file_t *pf)

{
  int iVar1;
  
  if (pf != (parasail_file_t *)0x0) {
    iVar1 = munmap(pf->buf,pf->size);
    if (iVar1 == -1) {
      perror("munmap");
      fwrite("parasail_close: cannot munmap file buffer\n",0x2a,1,_stderr);
    }
    iVar1 = close(pf->fd);
    if (iVar1 == -1) {
      perror("close");
      fwrite("parasail_close: cannot close file descriptor\n",0x2d,1,_stderr);
    }
    free(pf);
    return;
  }
  fwrite("parasail_close: NULL file\n",0x1a,1,_stderr);
  return;
}

Assistant:

void parasail_close(parasail_file_t *pf)
{
    if (NULL == pf) {
        fprintf(stderr, "parasail_close: NULL file\n");
        return;
    }
#if defined(HAVE_SYS_MMAN_H)
    if (-1 == munmap((void*)pf->buf, pf->size)) {
        perror("munmap");
        fprintf(stderr, "parasail_close: cannot munmap file buffer\n");
    }
    if (-1 == close(pf->fd)) {
        perror("close");
        fprintf(stderr, "parasail_close: cannot close file descriptor\n");
    }
#else
    free((void*)pf->buf);
    /* file was already closed */
#endif
    free(pf);
}